

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

void iutest::TestEnv::ParseCommandLine<char_const>(int *pargc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char *tmp;
  int local_20;
  int k;
  int i;
  int argc;
  char **argv_local;
  int *pargc_local;
  
  if (argv != (char **)0x0) {
    k = *pargc;
    local_20 = 0;
    while (local_20 < k) {
      bVar2 = ParseCommandLineElem<char_const>(argv[local_20]);
      if (bVar2) {
        k = k + -1;
        for (tmp._4_4_ = local_20; tmp._4_4_ < k; tmp._4_4_ = tmp._4_4_ + 1) {
          pcVar1 = argv[tmp._4_4_];
          argv[tmp._4_4_] = argv[tmp._4_4_ + 1];
          argv[tmp._4_4_ + 1] = pcVar1;
        }
      }
      else {
        local_20 = local_20 + 1;
      }
    }
    *pargc = k;
  }
  return;
}

Assistant:

static void ParseCommandLine(int* pargc, CharType** argv)
    {
        if( argv == NULL )
        {
            return;
        }
        int argc = *pargc;

        for( int i=0; i < argc; )
        {
            if( ParseCommandLineElem(argv[i]) )
            {
                --argc;
                // 見つかった場合、オプションを末尾に移動
                for( int k=i; k < argc; ++k )
                {
                    CharType* tmp = argv[k];
                    argv[k] = argv[k+1];
                    argv[k+1] = tmp;
                }
            }
            else
            {
                ++i;
            }
        }
        *pargc = argc;
    }